

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::IsProjectFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  allocator<char> local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,filename,&local_a1);
  psVar4 = cmake::GetHomeDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
  bVar1 = cmsys::SystemTools::IsSubDirectory(&local_40,psVar4);
  if (bVar1) {
    bVar3 = true;
    bVar2 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,filename,&local_a2);
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->GlobalGenerator->CMakeInstance);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&local_60,psVar4);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,filename,&local_a3);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"/CMakeFiles","");
      bVar3 = cmsys::SystemTools::IsSubDirectory(&local_80,&local_a0);
      bVar3 = !bVar3;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      bVar3 = false;
    }
  }
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if ((!bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmMakefile::IsProjectFile(const char* filename) const
{
  return cmSystemTools::IsSubDirectory(filename, this->GetHomeDirectory()) ||
    (cmSystemTools::IsSubDirectory(filename, this->GetHomeOutputDirectory()) &&
     !cmSystemTools::IsSubDirectory(filename, "/CMakeFiles"));
}